

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_serial.c
# Opt level: O0

slReturn setTermOptionsBaud(int fdPort,int baud)

{
  errInfo error;
  errInfo error_00;
  speed_t __speed;
  int *piVar1;
  char *pcVar2;
  errorInfo_slReturn local_160;
  errorInfo_slReturn local_140;
  errorInfo_slReturn local_120;
  errorInfo_slReturn local_100;
  errorInfo_slReturn local_e0;
  errorInfo_slReturn local_c0;
  int local_a0;
  undefined1 local_9c [4];
  int result;
  termios options;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined1 auStack_38 [4];
  int baudCookie;
  char *local_30;
  char *local_28;
  uint32_t local_20;
  undefined4 uStack_1c;
  int local_18;
  int local_14;
  int baud_local;
  int fdPort_local;
  
  local_18 = baud;
  local_14 = fdPort;
  if (fdPort < 0) {
    createErrorInfo((errorInfo_slReturn *)auStack_38,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"setTermOptionsBaud",0xba,(slReturn)0x0);
    error.fileName = local_30;
    error.cause = _auStack_38;
    error.functionName = local_28;
    error.lineNumber = local_20;
    error._28_4_ = uStack_1c;
    _baud_local = makeErrorMsgReturn(error,"Invalid serial port file descriptor");
  }
  else {
    __speed = getBaudRateCookie(baud);
    if ((int)__speed < 0) {
      createErrorInfo((errorInfo_slReturn *)&options.c_ispeed,
                      "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                      ,"setTermOptionsBaud",0xbc,(slReturn)0x0);
      error_00.fileName = (char *)local_58;
      error_00.cause = (slReturn)options._52_8_;
      error_00.functionName = (char *)local_50;
      error_00._24_8_ = local_48;
      _baud_local = makeErrorMsgReturn(error_00,"Invalid baud rate");
    }
    else {
      local_a0 = tcdrain(local_14);
      if (local_a0 < 0) {
        createErrorInfo(&local_c0,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"setTermOptionsBaud",0xc1,(slReturn)0x0);
        piVar1 = __errno_location();
        pcVar2 = strerror(*piVar1);
        _baud_local = makeErrorFmtMsgReturn(0x11ea31,pcVar2);
      }
      else {
        local_a0 = tcgetattr(local_14,(termios *)local_9c);
        if (local_a0 < 0) {
          createErrorInfo(&local_e0,
                          "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                          ,"setTermOptionsBaud",0xc3,(slReturn)0x0);
          piVar1 = __errno_location();
          pcVar2 = strerror(*piVar1);
          _baud_local = makeErrorFmtMsgReturn(0x11ea4a,pcVar2);
        }
        else {
          local_a0 = cfsetispeed((termios *)local_9c,__speed);
          if (local_a0 < 0) {
            createErrorInfo(&local_100,
                            "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                            ,"setTermOptionsBaud",0xc5,(slReturn)0x0);
            piVar1 = __errno_location();
            pcVar2 = strerror(*piVar1);
            _baud_local = makeErrorFmtMsgReturn(0x11ea65,pcVar2);
          }
          else {
            local_a0 = cfsetospeed((termios *)local_9c,__speed);
            if (local_a0 < 0) {
              createErrorInfo(&local_120,
                              "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                              ,"setTermOptionsBaud",199,(slReturn)0x0);
              piVar1 = __errno_location();
              pcVar2 = strerror(*piVar1);
              _baud_local = makeErrorFmtMsgReturn(0x11ea82,pcVar2);
            }
            else {
              local_a0 = tcflush(local_14,0);
              if (local_a0 < 0) {
                createErrorInfo(&local_140,
                                "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                                ,"setTermOptionsBaud",0xc9,(slReturn)0x0);
                piVar1 = __errno_location();
                pcVar2 = strerror(*piVar1);
                _baud_local = makeErrorFmtMsgReturn(0x11e9cf,pcVar2);
              }
              else {
                local_a0 = tcsetattr(local_14,0,(termios *)local_9c);
                if (local_a0 < 0) {
                  createErrorInfo(&local_160,
                                  "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                                  ,"setTermOptionsBaud",0xcb,(slReturn)0x0);
                  piVar1 = __errno_location();
                  pcVar2 = strerror(*piVar1);
                  _baud_local = makeErrorFmtMsgReturn(0x11ea9f,pcVar2);
                }
                else {
                  _baud_local = makeOkReturn();
                }
              }
            }
          }
        }
      }
    }
  }
  return _baud_local;
}

Assistant:

extern slReturn setTermOptionsBaud( int fdPort, int baud ) {

    if( fdPort < 0 ) return makeErrorMsgReturn( ERR_ROOT, "Invalid serial port file descriptor" );
    int baudCookie = getBaudRateCookie( baud );
    if( baudCookie < 0 ) return makeErrorMsgReturn( ERR_ROOT, "Invalid baud rate" );

    struct termios options;
    int result;
    result = tcdrain( fdPort );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcdrain(): %s", strerror(errno) );
    result = tcgetattr( fdPort, &options );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcgetattr(): %s", strerror(errno) );
    result = cfsetispeed( &options, (speed_t) baudCookie );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from cfsetispeed(): %s", strerror(errno) );
    result = cfsetospeed( &options, (speed_t) baudCookie );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from cfsetospeed(): %s", strerror(errno) );
    result = tcflush( fdPort, TCIFLUSH );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcflush(): %s", strerror(errno) );
    result = tcsetattr( fdPort, TCSANOW, &options );
    if( result < 0 ) return makeErrorFmtMsgReturn( ERR_ROOT, "error from tcsetattr(): %s", strerror(errno) );
    return makeOkReturn();
}